

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefer_class_enums.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  Direction local_c [4];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\t");
  local_c[3] = 0x4e;
  poVar1 = operator<<(poVar1,local_c + 3);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\t");
  local_c[2] = 0x45;
  poVar1 = operator<<(poVar1,local_c + 2);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\t");
  local_c[1] = 0x57;
  poVar1 = operator<<(poVar1,local_c + 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\t");
  local_c[0] = SOUTH;
  poVar1 = operator<<(poVar1,local_c);
  std::operator<<(poVar1,"\n");
  return 0;
}

Assistant:

int main() {
  std::cout << "\t" << Direction::NORTH << "\n"
            << "\t" << Direction::EAST  << "\n"
            << "\t" << Direction::WEST  << "\n"
            << "\t" << Direction::SOUTH << "\n";
}